

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O0

void anon_unknown.dwarf_2378a8::wheel(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  float fVar1;
  float fVar2;
  Rgba *pRVar3;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  float c;
  float phi;
  float rad;
  Rgba *p;
  int x;
  int y;
  float radMax;
  float yCen;
  float xCen;
  float radMin;
  float m;
  float n;
  float local_48;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  
  fVar1 = (float)in_ESI * 0.5;
  fVar2 = (float)in_EDX * 0.5;
  local_48 = fVar2;
  if (fVar1 < fVar2) {
    local_48 = fVar1;
  }
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
      pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)local_2c);
      pRVar3 = pRVar3 + local_30;
      dVar5 = std::sqrt((double)CONCAT44(extraout_XMM0_Db,
                                         ((float)local_30 - fVar1) * ((float)local_30 - fVar1) +
                                         ((float)local_2c - fVar2) * ((float)local_2c - fVar2)));
      fVar4 = SUB84(dVar5,0);
      if ((local_48 < fVar4) || (fVar4 < 25.46479)) {
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        (pRVar3->g)._h = (pRVar3->r)._h;
        (pRVar3->b)._h = (pRVar3->r)._h;
        (pRVar3->a)._h = (pRVar3->r)._h;
      }
      else {
        dVar5 = std::atan2((double)(ulong)(uint)((float)local_2c - fVar2),
                           (double)(ulong)(uint)((float)local_30 - fVar1));
        in_stack_ffffffffffffffc0 = SUB84(dVar5,0);
        dVar5 = std::sin((double)(ulong)(uint)(in_stack_ffffffffffffffc0 * 40.0 + fVar4 * 0.5));
        in_stack_ffffffffffffffbc = SUB84(dVar5,0) * 0.5 + 0.5;
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        (pRVar3->g)._h = (pRVar3->r)._h;
        (pRVar3->b)._h = (pRVar3->r)._h;
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
      }
    }
  }
  return;
}

Assistant:

void
wheel (Array2D<Rgba>& pixels, int w, int h)
{
    float n      = 40;
    float m      = 0.5;
    float radMin = 2 * n / M_PI;
    float xCen   = w * 0.5;
    float yCen   = h * 0.5;
    float radMax = (xCen < yCen) ? xCen : yCen;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];
            float rad =
                sqrt ((x - xCen) * (x - xCen) + (y - yCen) * (y - yCen));

            if (rad <= radMax && rad >= radMin)
            {
                float phi = atan2 (y - yCen, x - xCen);
                float c   = 0.5 + 0.5 * sin (phi * n + rad * m);

                p.r = 0.5 + 0.5 * c;
                p.g = p.r;
                p.b = p.r;
                p.a = 0.5 - 0.5 * c;
            }
            else
            {
                p.r = 0.5;
                p.g = p.r;
                p.b = p.r;
                p.a = p.r;
            }
        }
    }
}